

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<unsigned_int> * testing::A<unsigned_int>(void)

{
  void *__s;
  Matcher<unsigned_int> *in_RDI;
  MatcherInterface<unsigned_int> *in_stack_ffffffffffffffd8;
  Matcher<unsigned_int> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<unsigned_int>::AnyMatcherImpl((AnyMatcherImpl<unsigned_int> *)this);
  MakeMatcher<unsigned_int>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }